

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_key.cpp
# Opt level: O2

ARTKey duckdb::ARTKey::CreateARTKey<char_const*>(ArenaAllocator *allocator,char *value)

{
  uint uVar1;
  size_t sVar2;
  undefined8 in_RCX;
  ARTKey AVar3;
  string_t value_00;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 local_1c;
  
  sVar2 = strlen(value);
  uVar1 = (uint)sVar2;
  if (uVar1 < 0xd) {
    local_1c = 0;
    uStack_24 = 0;
    uStack_20 = 0;
    if (uVar1 == 0) {
      value = (char *)0x0;
    }
    else {
      switchD_016b0717::default(&uStack_24,value,(ulong)(uVar1 & 0xf));
      value = (char *)CONCAT44(local_1c,uStack_20);
    }
  }
  else {
    uStack_24 = *(undefined4 *)value;
  }
  value_00.value.pointer.ptr = (char *)in_RCX;
  value_00.value._0_8_ = value;
  AVar3 = CreateARTKey<duckdb::string_t>
                    ((ARTKey *)allocator,(ArenaAllocator *)CONCAT44(uStack_24,uVar1),value_00);
  return AVar3;
}

Assistant:

ARTKey ARTKey::CreateARTKey(ArenaAllocator &allocator, const char *value) {
	return ARTKey::CreateARTKey(allocator, string_t(value, UnsafeNumericCast<uint32_t>(strlen(value))));
}